

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void translateImmediate(MCInst *mcInst,uint64_t immediate,OperandSpecifier *operand,
                       InternalInstruction *insn)

{
  uint8_t uVar1;
  bool bVar2;
  uint uVar3;
  uint local_3c;
  uint local_38;
  uint NewOpc_1;
  uint NewOpc;
  _Bool check_opcode;
  uint32_t Opcode;
  OperandType type;
  InternalInstruction *insn_local;
  OperandSpecifier *operand_local;
  uint64_t immediate_local;
  MCInst *mcInst_local;
  
  uVar1 = operand->type;
  operand_local = (OperandSpecifier *)immediate;
  if (uVar1 == 'P') {
    switch(insn->displacementSize) {
    case '\x01':
      if ((immediate & 0x80) != 0) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffffffffff00);
      }
      break;
    case '\x02':
      if ((immediate & 0x8000) != 0) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffffffff0000);
      }
      break;
    default:
      break;
    case '\x04':
      if ((immediate & 0x80000000) != 0) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffff00000000);
      }
      break;
    case '\b':
    }
  }
  else if ((((uVar1 == '\f') || (uVar1 == '\r')) || (uVar1 == '\x0e')) ||
          ((uVar1 == '\x0f' || (uVar1 == 'O')))) {
    uVar3 = MCInst_getOpcode(mcInst);
    switch(operand->encoding) {
    case '\x11':
      bVar2 = false;
      if ((((uVar3 != 0xfe) && (bVar2 = false, uVar3 != 0xfc)) &&
          ((bVar2 = false, uVar3 != 0x79d &&
           (((bVar2 = false, uVar3 != 0x6df && (bVar2 = false, uVar3 != 0x2da)) &&
            (bVar2 = false, uVar3 != 0x2d8)))))) &&
         (((bVar2 = false, uVar3 != 0x390 && (bVar2 = false, uVar3 != 0xbe6)) &&
          ((bVar2 = false, uVar3 != 0xbe5 &&
           (((bVar2 = false, uVar3 != 0xbe2 && (bVar2 = false, uVar3 != 0xbe1)) &&
            ((bVar2 = false, uVar3 != 0x1268 &&
             ((((bVar2 = false, uVar3 != 0x1181 && (bVar2 = false, uVar3 != 0xcfb)) &&
               (bVar2 = false, uVar3 != 0xcfa)) &&
              ((bVar2 = false, uVar3 != 0xcf9 && (bVar2 = false, uVar3 != 0xf1b)))))))))))))) {
        bVar2 = uVar3 != 0x395;
      }
      if ((bVar2) && ((immediate & 0x80) != 0)) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffffffffff00);
      }
      break;
    case '\x12':
      if ((immediate & 0x8000) != 0) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffffffff0000);
      }
      break;
    case '\x13':
      if ((immediate & 0x80000000) != 0) {
        operand_local = (OperandSpecifier *)(immediate | 0xffffffff00000000);
      }
      break;
    case '\x14':
    }
  }
  else if (uVar1 == '\x10') {
    if (7 < immediate) {
      local_38 = 0;
      uVar3 = MCInst_getOpcode(mcInst);
      switch(uVar3) {
      case 0x226:
        local_38 = 0x227;
        break;
      default:
        break;
      case 0x228:
        local_38 = 0x229;
        break;
      case 0x22a:
        local_38 = 0x22b;
        break;
      case 0x22c:
        local_38 = 0x22d;
        break;
      case 0x22f:
        local_38 = 0x230;
        break;
      case 0x231:
        local_38 = 0x232;
        break;
      case 0x235:
        local_38 = 0x236;
        break;
      case 0x237:
        local_38 = 0x238;
      }
      MCInst_setOpcode(mcInst,local_38);
    }
  }
  else if ((uVar1 == '\x11') && (0x1f < immediate)) {
    local_3c = 0;
    uVar3 = MCInst_getOpcode(mcInst);
    switch(uVar3) {
    case 0xc01:
      local_3c = 0xc02;
      break;
    default:
      break;
    case 0xc03:
      local_3c = 0xc04;
      break;
    case 0xc05:
      local_3c = 0xc06;
      break;
    case 0xc07:
      local_3c = 0xc08;
      break;
    case 0xc0a:
      local_3c = 0xc0b;
      break;
    case 0xc0c:
      local_3c = 0xc0d;
      break;
    case 0xc0e:
      local_3c = 0xc0f;
      break;
    case 0xc10:
      local_3c = 0xc11;
      break;
    case 0xc12:
      local_3c = 0xc13;
      break;
    case 0xc14:
      local_3c = 0xc15;
      break;
    case 0xc17:
      local_3c = 0xc18;
      break;
    case 0xc19:
      local_3c = 0xc1a;
      break;
    case 0xc1b:
      local_3c = 0xc1c;
      break;
    case 0xc1d:
      local_3c = 0xc1e;
      break;
    case 0xc1f:
      local_3c = 0xc20;
      break;
    case 0xc21:
      local_3c = 0xc22;
      break;
    case 0xc23:
      local_3c = 0xc24;
      break;
    case 0xc25:
      local_3c = 0xc26;
      break;
    case 0xc27:
      local_3c = 0xc28;
      break;
    case 0xc29:
      local_3c = 0xc2a;
    }
    MCInst_setOpcode(mcInst,local_3c);
  }
  switch(uVar1) {
  case '\x01':
    if (((ulong)operand_local & 0x80) != 0) {
      operand_local = (OperandSpecifier *)((ulong)operand_local | 0xffffffffffffff00);
    }
    break;
  default:
    break;
  case '\x03':
  case '\x04':
    if (((ulong)operand_local & 0x80000000) != 0) {
      operand_local = (OperandSpecifier *)((ulong)operand_local | 0xffffffff00000000);
    }
    break;
  case '=':
  case '>':
  case '?':
    MCOperand_CreateReg0(mcInst,((uint)((ulong)operand_local >> 4) & 0xfffffff) + 0x72);
    return;
  case '@':
    MCOperand_CreateReg0(mcInst,((uint)((ulong)operand_local >> 4) & 0xfffffff) + 0x92);
    return;
  case 'A':
    MCOperand_CreateReg0(mcInst,((uint)((ulong)operand_local >> 4) & 0xfffffff) + 0xb2);
    return;
  }
  MCOperand_CreateImm0(mcInst,(int64_t)operand_local);
  if ((((uVar1 == '-') || (uVar1 == '.')) || (uVar1 == '/')) || (uVar1 == '0')) {
    MCOperand_CreateReg0(mcInst,(uint)""[insn->segmentOverride]);
  }
  return;
}

Assistant:

static void translateImmediate(MCInst *mcInst, uint64_t immediate,
		const OperandSpecifier *operand, InternalInstruction *insn)
{
	OperandType type;

	type = (OperandType)operand->type;
	if (type == TYPE_RELv) {
		//isBranch = true;
		//pcrel = insn->startLocation + insn->immediateOffset + insn->immediateSize;
		switch (insn->displacementSize) {
			case 1:
				if (immediate & 0x80)
					immediate |= ~(0xffull);
				break;
			case 2:
				if (immediate & 0x8000)
					immediate |= ~(0xffffull);
				break;
			case 4:
				if (immediate & 0x80000000)
					immediate |= ~(0xffffffffull);
				break;
			case 8:
				break;
			default:
				break;
		}
	} // By default sign-extend all X86 immediates based on their encoding.
	else if (type == TYPE_IMM8 || type == TYPE_IMM16 || type == TYPE_IMM32 ||
			type == TYPE_IMM64 || type == TYPE_IMMv) {

		uint32_t Opcode = MCInst_getOpcode(mcInst);
		bool check_opcode;

		switch (operand->encoding) {
			default:
				break;
			case ENCODING_IB:
				// Special case those X86 instructions that use the imm8 as a set of
				// bits, bit count, etc. and are not sign-extend.
				check_opcode = (Opcode != X86_INT);
#ifndef CAPSTONE_X86_REDUCE
        check_opcode = ((Opcode != X86_BLENDPSrri &&
						            Opcode != X86_BLENDPDrri &&
						            Opcode != X86_PBLENDWrri &&
						            Opcode != X86_MPSADBWrri &&
						            Opcode != X86_DPPSrri &&
						            Opcode != X86_DPPDrri &&
						            Opcode != X86_INSERTPSrr &&
						            Opcode != X86_VBLENDPSYrri &&
						            Opcode != X86_VBLENDPSYrmi &&
						            Opcode != X86_VBLENDPDYrri &&
						            Opcode != X86_VBLENDPDYrmi &&
						            Opcode != X86_VPBLENDWrri &&
						            Opcode != X86_VMPSADBWrri &&
						            Opcode != X86_VDPPSYrri &&
						            Opcode != X86_VDPPSYrmi &&
						            Opcode != X86_VDPPDrri &&
						            Opcode != X86_VINSERTPSrr) && check_opcode);
#endif
				if (check_opcode)
						if(immediate & 0x80)
							immediate |= ~(0xffull);
				break;
			case ENCODING_IW:
				if(immediate & 0x8000)
					immediate |= ~(0xffffull);
				break;
			case ENCODING_ID:
				if(immediate & 0x80000000)
					immediate |= ~(0xffffffffull);
				break;
			case ENCODING_IO:
				break;
		}
	} else if (type == TYPE_IMM3) {
#ifndef CAPSTONE_X86_REDUCE
		// Check for immediates that printSSECC can't handle.
		if (immediate >= 8) {
			unsigned NewOpc = 0;

			switch (MCInst_getOpcode(mcInst)) {
				default: break;	// never reach
				case X86_CMPPDrmi: NewOpc = X86_CMPPDrmi_alt; break;
				case X86_CMPPDrri: NewOpc = X86_CMPPDrri_alt; break;
				case X86_CMPPSrmi: NewOpc = X86_CMPPSrmi_alt; break;
				case X86_CMPPSrri: NewOpc = X86_CMPPSrri_alt; break;
				case X86_CMPSDrm:  NewOpc = X86_CMPSDrm_alt;  break;
				case X86_CMPSDrr:  NewOpc = X86_CMPSDrr_alt;  break;
				case X86_CMPSSrm:  NewOpc = X86_CMPSSrm_alt;  break;
				case X86_CMPSSrr:  NewOpc = X86_CMPSSrr_alt;  break;
			}
			// Switch opcode to the one that doesn't get special printing.
			MCInst_setOpcode(mcInst, NewOpc);
		}
#endif
	} else if (type == TYPE_IMM5) {
#ifndef CAPSTONE_X86_REDUCE
		// Check for immediates that printAVXCC can't handle.
		if (immediate >= 32) {
			unsigned NewOpc = 0;

			switch (MCInst_getOpcode(mcInst)) {
				default: break; // unexpected opcode
				case X86_VCMPPDrmi:  NewOpc = X86_VCMPPDrmi_alt;  break;
				case X86_VCMPPDrri:  NewOpc = X86_VCMPPDrri_alt;  break;
				case X86_VCMPPSrmi:  NewOpc = X86_VCMPPSrmi_alt;  break;
				case X86_VCMPPSrri:  NewOpc = X86_VCMPPSrri_alt;  break;
				case X86_VCMPSDrm:   NewOpc = X86_VCMPSDrm_alt;   break;
				case X86_VCMPSDrr:   NewOpc = X86_VCMPSDrr_alt;   break;
				case X86_VCMPSSrm:   NewOpc = X86_VCMPSSrm_alt;   break;
				case X86_VCMPSSrr:   NewOpc = X86_VCMPSSrr_alt;   break;
				case X86_VCMPPDYrmi: NewOpc = X86_VCMPPDYrmi_alt; break;
				case X86_VCMPPDYrri: NewOpc = X86_VCMPPDYrri_alt; break;
				case X86_VCMPPSYrmi: NewOpc = X86_VCMPPSYrmi_alt; break;
				case X86_VCMPPSYrri: NewOpc = X86_VCMPPSYrri_alt; break;
				case X86_VCMPPDZrmi: NewOpc = X86_VCMPPDZrmi_alt; break;
				case X86_VCMPPDZrri: NewOpc = X86_VCMPPDZrri_alt; break;
				case X86_VCMPPSZrmi: NewOpc = X86_VCMPPSZrmi_alt; break;
				case X86_VCMPPSZrri: NewOpc = X86_VCMPPSZrri_alt; break;
				case X86_VCMPSDZrm:  NewOpc = X86_VCMPSDZrmi_alt; break;
				case X86_VCMPSDZrr:  NewOpc = X86_VCMPSDZrri_alt; break;
				case X86_VCMPSSZrm:  NewOpc = X86_VCMPSSZrmi_alt; break;
				case X86_VCMPSSZrr:  NewOpc = X86_VCMPSSZrri_alt; break;
			}
			// Switch opcode to the one that doesn't get special printing.
			MCInst_setOpcode(mcInst, NewOpc);
		}
#endif
	}

	switch (type) {
		case TYPE_XMM32:
		case TYPE_XMM64:
		case TYPE_XMM128:
			MCOperand_CreateReg0(mcInst, X86_XMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_XMM256:
			MCOperand_CreateReg0(mcInst, X86_YMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_XMM512:
			MCOperand_CreateReg0(mcInst, X86_ZMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_REL8:
			if(immediate & 0x80)
				immediate |= ~(0xffull);
			break;
		case TYPE_REL32:
		case TYPE_REL64:
			if(immediate & 0x80000000)
				immediate |= ~(0xffffffffull);
			break;
		default:
			// operand is 64 bits wide.  Do nothing.
			break;
	}

	MCOperand_CreateImm0(mcInst, immediate);

	if (type == TYPE_MOFFS8 || type == TYPE_MOFFS16 ||
			type == TYPE_MOFFS32 || type == TYPE_MOFFS64) {
		MCOperand_CreateReg0(mcInst, segmentRegnums[insn->segmentOverride]);
	}
}